

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_tests.cpp
# Opt level: O0

void validation_tests::TestBlockSubsidyHalvings(Params *consensusParams)

{
  bool bVar1;
  long in_FS_OFFSET;
  int nHeight;
  int nHalvings;
  CAmount nInitialSubsidy;
  int maxHalvings;
  CAmount nSubsidy;
  CAmount nPreviousSubsidy;
  char *in_stack_fffffffffffffd68;
  lazy_ostream *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd84;
  const_string *in_stack_fffffffffffffd90;
  const_string *msg;
  size_t in_stack_fffffffffffffd98;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffffda0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffda8;
  char *this;
  int local_1d0;
  lazy_ostream local_19c;
  const_string local_160;
  undefined1 local_150 [16];
  lazy_ostream local_140;
  undefined1 local_128 [40];
  const_string local_e8 [2];
  lazy_ostream local_c8 [2];
  assertion_result local_a8 [2];
  CAmount local_70;
  lazy_ostream local_68;
  undefined1 local_50 [64];
  CAmount local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 10000000000;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd78,
               (pointer)in_stack_fffffffffffffd70,(unsigned_long)in_stack_fffffffffffffd68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               in_stack_fffffffffffffd90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffd70,(char (*) [1])in_stack_fffffffffffffd68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd78,
               (pointer)in_stack_fffffffffffffd70,(unsigned_long)in_stack_fffffffffffffd68);
    local_68._vptr_lazy_ostream = (_func_int **)0x2540be400;
    in_stack_fffffffffffffd78 = "nInitialSubsidy * 2";
    in_stack_fffffffffffffd70 = &local_68;
    in_stack_fffffffffffffd68 = "nPreviousSubsidy";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_50,&local_68.m_empty,0x1e,1,2,&local_10);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (local_1d0 = 0; local_1d0 < 0x40; local_1d0 = local_1d0 + 1) {
    local_70 = GetBlockSubsidy(in_stack_fffffffffffffd84,(Params *)in_stack_fffffffffffffd78);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd78,
                 (pointer)in_stack_fffffffffffffd70,(unsigned_long)in_stack_fffffffffffffd68);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd68);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 in_stack_fffffffffffffd90);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffd78,
                 SUB81((ulong)in_stack_fffffffffffffd70 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd78,
                 (pointer)in_stack_fffffffffffffd70,(unsigned_long)in_stack_fffffffffffffd68);
      boost::unit_test::operator<<
                (in_stack_fffffffffffffd70,(basic_cstring<const_char> *)in_stack_fffffffffffffd68);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd78,
                 (pointer)in_stack_fffffffffffffd70,(unsigned_long)in_stack_fffffffffffffd68);
      in_stack_fffffffffffffd68 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_a8,local_c8,local_e8,0x22,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffd68);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffd68);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd78,
                 (pointer)in_stack_fffffffffffffd70,(unsigned_long)in_stack_fffffffffffffd68);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd68);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 in_stack_fffffffffffffd90);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffffd70,(char (*) [1])in_stack_fffffffffffffd68);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd78,
                 (pointer)in_stack_fffffffffffffd70,(unsigned_long)in_stack_fffffffffffffd68);
      local_140._vptr_lazy_ostream = (_func_int **)(local_10 / 2);
      in_stack_fffffffffffffd78 = "nPreviousSubsidy / 2";
      in_stack_fffffffffffffd70 = &local_140;
      in_stack_fffffffffffffd68 = "nSubsidy";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_128,&local_140.m_empty,0x23,1,2);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffd68);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    local_10 = local_70;
  }
  do {
    this = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    line_num = local_150;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd78,
               (pointer)in_stack_fffffffffffffd70,(unsigned_long)in_stack_fffffffffffffd68);
    file = &local_160;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffd70,(char (*) [1])in_stack_fffffffffffffd68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd78,
               (pointer)in_stack_fffffffffffffd70,(unsigned_long)in_stack_fffffffffffffd68);
    local_19c._4_8_ = GetBlockSubsidy(in_stack_fffffffffffffd84,(Params *)in_stack_fffffffffffffd78)
    ;
    local_19c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffffd78 = "0";
    in_stack_fffffffffffffd70 = &local_19c;
    in_stack_fffffffffffffd68 =
         "GetBlockSubsidy(maxHalvings * consensusParams.nSubsidyHalvingInterval, consensusParams)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (&stack0xfffffffffffffe80,&local_19c.field_0xc,0x26,1,2,
               (undefined1 *)((long)&local_19c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void TestBlockSubsidyHalvings(const Consensus::Params& consensusParams)
{
    int maxHalvings = 64;
    CAmount nInitialSubsidy = 50 * COIN;

    CAmount nPreviousSubsidy = nInitialSubsidy * 2; // for height == 0
    BOOST_CHECK_EQUAL(nPreviousSubsidy, nInitialSubsidy * 2);
    for (int nHalvings = 0; nHalvings < maxHalvings; nHalvings++) {
        int nHeight = nHalvings * consensusParams.nSubsidyHalvingInterval;
        CAmount nSubsidy = GetBlockSubsidy(nHeight, consensusParams);
        BOOST_CHECK(nSubsidy <= nInitialSubsidy);
        BOOST_CHECK_EQUAL(nSubsidy, nPreviousSubsidy / 2);
        nPreviousSubsidy = nSubsidy;
    }
    BOOST_CHECK_EQUAL(GetBlockSubsidy(maxHalvings * consensusParams.nSubsidyHalvingInterval, consensusParams), 0);
}